

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O0

int __thiscall GPIOClass::unexport_gpio(GPIOClass *this)

{
  byte bVar1;
  undefined8 uVar2;
  ostream *poVar3;
  string *in_RDI;
  ofstream unexportgpio;
  string unexport_str;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  allocator<char> local_31;
  string local_30 [44];
  int local_4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  std::allocator<char>::~allocator(&local_31);
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(&stack0xfffffffffffffdb8,uVar2,0x10);
  bVar1 = std::ios::operator!((ios *)(&stack0xfffffffffffffdb8 +
                                     *(long *)(in_stack_fffffffffffffdb8 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&stack0xfffffffffffffdb8,in_RDI);
    std::ofstream::close();
    local_4 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout," OPERATION FAILED: Unable to unexport GPIO");
    poVar3 = std::operator<<(poVar3,in_RDI);
    poVar3 = std::operator<<(poVar3," .");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  std::ofstream::~ofstream(&stack0xfffffffffffffdb8);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int GPIOClass::unexport_gpio()
{
    string unexport_str = "/sys/class/gpio/unexport";
    ofstream unexportgpio(unexport_str.c_str()); //Open unexport file
    if (!unexportgpio){
        cout << " OPERATION FAILED: Unable to unexport GPIO"<< this->gpionum <<" ."<< endl;
        return -1;
    }

    unexportgpio << this->gpionum ; //write GPIO number to unexport
    unexportgpio.close(); //close unexport file
    return 0;
}